

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O1

string * __thiscall
verilogAST::Module::emitModuleHeader_abi_cxx11_(string *__return_storage_ptr__,Module *this)

{
  size_type *psVar1;
  pointer pbVar2;
  pointer pbVar3;
  undefined1 *puVar4;
  pointer puVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  pointer pbVar9;
  __index_type *p_Var10;
  pointer puVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports_strs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [24];
  undefined4 uStack_130;
  undefined4 uStack_12c;
  pointer *local_128;
  long local_120;
  pointer local_118 [2];
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  Module *local_c8;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::operator+(__return_storage_ptr__,"module ",&this->name);
  if (*(long *)&this->parameters != *(long *)&this->field_0x60) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var10 = *(__index_type **)&this->parameters;
    puVar4 = *(undefined1 **)&this->field_0x60;
    local_c8 = this;
    if (p_Var10 != puVar4) {
      pbVar3 = (pointer)(local_148 + 0x10);
      do {
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/verilogAST.cpp:10:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
          ::_S_vtable._M_arr[p_Var10[8]]._M_data)
                  (&local_80,(anon_class_1_0_00000001 *)&local_128,
                   (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                    *)p_Var10);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x165bb4);
        local_108 = &local_f8;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_f8 = *plVar8;
          lStack_f0 = plVar6[3];
        }
        else {
          local_f8 = *plVar8;
          local_108 = (long *)*plVar6;
        }
        local_100 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
        pbVar9 = (pointer)(plVar6 + 2);
        if ((pointer)*plVar6 == pbVar9) {
          local_148._16_8_ = (pbVar9->_M_dataplus)._M_p;
          uStack_130 = (undefined4)plVar6[3];
          uStack_12c = *(undefined4 *)((long)plVar6 + 0x1c);
          local_148._0_8_ = pbVar3;
        }
        else {
          local_148._16_8_ = (pbVar9->_M_dataplus)._M_p;
          local_148._0_8_ = (pointer)*plVar6;
        }
        local_148._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (**(code **)**(undefined8 **)
                      &(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                          *)(p_Var10 + 0x10))->
                       super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       ).
                       super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       ._M_u)((anon_class_1_0_00000001 *)&local_128);
        pbVar9 = (pointer)0xf;
        if ((pointer)local_148._0_8_ != pbVar3) {
          pbVar9 = (pointer)local_148._16_8_;
        }
        pbVar2 = (pointer)((long)&((_Alloc_hider *)local_148._8_8_)->_M_p + local_120);
        if (pbVar9 < pbVar2) {
          pbVar9 = (pointer)0xf;
          if (local_128 != local_118) {
            pbVar9 = local_118[0];
          }
          if (pbVar9 < pbVar2) goto LAB_00144e52;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,local_148._0_8_);
        }
        else {
LAB_00144e52:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append(local_148,(ulong)local_128);
        }
        psVar1 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_168.field_2._M_allocated_capacity = *psVar1;
          local_168.field_2._8_8_ = puVar7[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar1;
          local_168._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_168._M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                   &local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (local_128 != local_118) {
          operator_delete(local_128,(ulong)((long)&(local_118[0]->_M_dataplus)._M_p + 1));
        }
        if ((pointer)local_148._0_8_ != pbVar3) {
          operator_delete((void *)local_148._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_148._16_8_)->_M_p + 1));
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        p_Var10 = p_Var10 + 0x18;
      } while (p_Var10 != puVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&local_e8);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,",\n    ","");
    join(&local_168,&local_48,&local_a0);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_168._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    this = local_c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (pointer)0x0;
  local_148._16_8_ = (pointer)0x0;
  puVar11 = (this->ports).
            super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->ports).
           super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar5) {
    do {
      (**(((puVar11->_M_t).
           super___uniq_ptr_impl<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
           ._M_t.
           super__Tuple_impl<0UL,_verilogAST::AbstractPort_*,_std::default_delete<verilogAST::AbstractPort>_>
           .super__Head_base<0UL,_verilogAST::AbstractPort_*,_false>._M_head_impl)->super_Node).
         _vptr_Node)(&local_168);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_148,
                 &local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar5);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_148);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,",\n    ","");
  join(&local_168,&local_60,&local_c0);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  return __return_storage_ptr__;
}

Assistant:

std::string Module::emitModuleHeader() {
  std::string module_header_str = "module " + name;

  // emit parameter string
  if (!parameters.empty()) {
    module_header_str += " #(\n    ";
    std::vector<std::string> param_strs;
    for (auto &it : parameters) {
      param_strs.push_back("parameter " + variant_to_string(it.first) + " = " +
                           it.second->toString());
    }
    module_header_str += join(param_strs, ",\n    ");
    module_header_str += "\n)";
  }

  // emit port string
  module_header_str += " (\n    ";
  std::vector<std::string> ports_strs;
  for (auto &it : ports) ports_strs.push_back(it->toString());
  module_header_str += join(ports_strs, ",\n    ");
  module_header_str += "\n);\n";
  return module_header_str;
}